

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable_binary.hpp
# Opt level: O1

void __thiscall
cereal::PortableBinaryOutputArchive::PortableBinaryOutputArchive
          (PortableBinaryOutputArchive *this,ostream *stream,Options *options)

{
  Endianness EVar1;
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  (this->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).super_OutputArchiveBase.
  _vptr_OutputArchiveBase = (_func_int **)&PTR__OutputArchive_003ede78;
  uStack_28 = in_RAX;
  OutputArchive<cereal::PortableBinaryOutputArchive,_1U>::OutputArchive
            (&this->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>,this);
  (this->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).super_OutputArchiveBase.
  _vptr_OutputArchiveBase = (_func_int **)&PTR__OutputArchive_003ede78;
  this->itsStream = stream;
  EVar1 = options->itsOutputEndianness;
  this->itsConvertEndianness =
       (EVar1 == little) != (portable_binary_detail::is_little_endian()::test == '\x01');
  uStack_28 = CONCAT17(EVar1 == little,(undefined7)uStack_28);
  saveBinary<1ul>((((((this->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
                    super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
                  super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self,
                  (void *)((long)&uStack_28 + 7),1);
  return;
}

Assistant:

PortableBinaryOutputArchive(std::ostream & stream, Options const & options = Options::Default()) :
        OutputArchive<PortableBinaryOutputArchive, AllowEmptyClassElision>(this),
        itsStream(stream),
        itsConvertEndianness( portable_binary_detail::is_little_endian() ^ options.is_little_endian() )
      {
        this->operator()( options.is_little_endian() );
      }